

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

void __thiscall DataServer::saveFile(DataServer *this)

{
  int __val;
  longlong lVar1;
  bool bVar2;
  pointer ppVar3;
  void *pvVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>,_std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>_>
  pVar5;
  __cxx11 local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [32];
  string local_298 [8];
  ofstream myblockFile;
  char *buffer;
  int _count;
  longlong _from;
  _Self _Stack_78;
  int _blockId;
  _Rb_tree_iterator<std::pair<const_int,_fileRange>_> f_it;
  __cxx11 local_60 [32];
  string local_40 [8];
  string nodePath;
  _Rb_tree_iterator<std::pair<const_int,_fileRange>_> local_20;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>,_std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>_>
  fileRanges;
  DataServer *this_local;
  
  fileRanges.second._M_node = (_Base_ptr)this;
  pVar5 = std::
          multimap<int,_fileRange,_std::less<int>,_std::allocator<std::pair<const_int,_fileRange>_>_>
          ::equal_range(&server_fileRangesMap,&this->serverId);
  std::__cxx11::to_string(local_60,this->serverId);
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "dfsfiles/datanode");
  std::__cxx11::string::~string((string *)local_60);
  local_20 = pVar5.first._M_node;
  _Stack_78._M_node = local_20._M_node;
  while( true ) {
    bVar2 = std::operator!=(&stack0xffffffffffffff88,&fileRanges.first);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>::operator->
                       (&stack0xffffffffffffff88);
    __val = (ppVar3->second).blockId;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>::operator->
                       (&stack0xffffffffffffff88);
    lVar1 = (ppVar3->second).from;
    std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>::operator->(&stack0xffffffffffffff88);
    pvVar4 = operator_new__(0x200000);
    std::istream::seekg(0x185828,(_Ios_Seekdir)lVar1);
    std::istream::read(ifs,(long)pvVar4);
    std::istream::seekg(0x185828,_S_beg);
    std::ofstream::ofstream(local_298);
    std::operator+(local_318,(char *)local_40);
    std::operator+(local_2f8,local_318);
    std::operator+(local_2d8,(char *)local_2f8);
    std::__cxx11::to_string(local_338,__val);
    std::operator+(local_2b8,local_2d8);
    std::ofstream::open(local_298,(_Ios_Openmode)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)local_318);
    std::ostream::write((char *)local_298,(long)pvVar4);
    std::ofstream::close();
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    std::ofstream::~ofstream(local_298);
    std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>::operator++(&stack0xffffffffffffff88);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void saveFile() const
    {
        // dfs/datanode[1,2,3,4]/
        // check the server_fileRangesMap
        // <serverid, range{from, count, blockid}>
        auto fileRanges = server_fileRangesMap.equal_range(serverId);
        string nodePath = "dfsfiles/datanode" + to_string(serverId);
        for (auto f_it = fileRanges.first; f_it!= fileRanges.second; ++f_it)
        {
            int _blockId = (f_it->second).blockId;
            long long _from = (f_it->second).from;
            int _count = (f_it->second).count;
            char *buffer = new char[block_size_int];
            ifs.seekg(_from, ifs.beg);

            ifs.read(buffer, _count);

            ifs.seekg(0, ifs.beg);

            ofstream myblockFile;

            myblockFile.open(nodePath + "/" + desFileName + "-part" + to_string(_blockId));

            myblockFile.write(buffer, _count);

            myblockFile.close();

            delete[] buffer;
        }


    }